

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

IVec3 __thiscall
deqp::gles31::Functional::anon_unknown_0::getTexelBlockStride
          (anon_unknown_0 *this,ImageInfo *info,int level)

{
  int x_;
  deUint32 dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  IVec3 *baseSize;
  int extraout_EDX;
  IVec3 IVar5;
  undefined1 local_44 [8];
  IVec3 textureTexelBlockSize;
  IVec3 texelBlockPixelSize;
  int texelBlockSize;
  IVec3 size;
  int level_local;
  ImageInfo *info_local;
  
  dVar1 = ImageInfo::getTarget(info);
  baseSize = ImageInfo::getSize(info);
  getLevelSize((anon_unknown_0 *)(texelBlockPixelSize.m_data + 2),dVar1,baseSize,level);
  dVar1 = ImageInfo::getFormat(info);
  texelBlockPixelSize.m_data[1] = getTexelBlockSize(dVar1);
  dVar1 = ImageInfo::getFormat(info);
  getTexelBlockPixelSize((anon_unknown_0 *)(textureTexelBlockSize.m_data + 1),dVar1);
  divRoundUp((anon_unknown_0 *)local_44,(IVec3 *)(texelBlockPixelSize.m_data + 2),
             (IVec3 *)(textureTexelBlockSize.m_data + 1));
  x_ = texelBlockPixelSize.m_data[1];
  iVar2 = tcu::Vector<int,_3>::x((Vector<int,_3> *)local_44);
  iVar2 = iVar2 * texelBlockPixelSize.m_data[1];
  iVar3 = tcu::Vector<int,_3>::x((Vector<int,_3> *)local_44);
  iVar4 = tcu::Vector<int,_3>::y((Vector<int,_3> *)local_44);
  tcu::Vector<int,_3>::Vector
            ((Vector<int,_3> *)this,x_,iVar2,iVar3 * iVar4 * texelBlockPixelSize.m_data[1]);
  IVar5.m_data[2] = extraout_EDX;
  IVar5.m_data._0_8_ = this;
  return (IVec3)IVar5.m_data;
}

Assistant:

IVec3 getTexelBlockStride (const ImageInfo& info, int level)
{
	const IVec3	size					= getLevelSize(info.getTarget(), info.getSize(), level);
	const int	texelBlockSize			= getTexelBlockSize(info.getFormat());
	const IVec3 texelBlockPixelSize		= getTexelBlockPixelSize(info.getFormat());
	const IVec3 textureTexelBlockSize	= divRoundUp(size, texelBlockPixelSize);

	return IVec3(texelBlockSize, textureTexelBlockSize.x() * texelBlockSize, textureTexelBlockSize.x() * textureTexelBlockSize.y() * texelBlockSize);
}